

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

void duckdb::BitwiseNOTOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  sel_t *idx;
  reference vector;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  idx_t in_RCX;
  ValidityMask *other;
  ValidityMask *pVVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> count;
  void *in_R8;
  data_ptr_t pdVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t sVar15;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  ValidityMask local_a8;
  element_type *local_88;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args->count;
  local_a8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)result;
  local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = count._M_pi;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar11 = result->data;
    pdVar4 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      lVar8 = 8;
      while (bVar14 = count._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0,
            count._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&count._M_pi[-1]._M_weak_count + 3), bVar14) {
        sVar15.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + lVar8);
        sVar15.value._0_8_ = *(undefined8 *)(pdVar4 + lVar8 + -8);
        sVar15 = UnaryLambdaWrapper::
                 Operation<duckdb::BitwiseNOTOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                           (sVar15,&local_a8,in_RCX,in_R8);
        *(long *)(pdVar11 + lVar8 + -8) = sVar15.value._0_8_;
        *(long *)(pdVar11 + lVar8) = sVar15.value._8_8_;
        lVar8 = lVar8 + 0x10;
      }
    }
    else {
      other = &vector->validity;
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &other->super_TemplatedValidityMask<unsigned_long>);
      local_88 = (element_type *)((ulong)((long)&count._M_pi[3]._M_weak_count + 3U) >> 6);
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a8.super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)other;
      local_80 = pdVar11;
      for (local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr = (element_type *)0x0;
          local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != local_88;
          local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    ((long)&((local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                              internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false> + 1)) {
        puVar3 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          p_Var6 = p_Var9 + 4;
          if (count._M_pi <= p_Var9 + 4) {
            p_Var6 = count._M_pi;
          }
LAB_01d4e53a:
          uVar12 = (long)p_Var9 << 4 | 8;
          for (; p_Var5 = p_Var9,
              pVVar7 = (ValidityMask *)local_a8.super_TemplatedValidityMask<unsigned_long>.capacity,
              p_Var9 < p_Var6;
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&p_Var9->_vptr__Sp_counted_base + 1)) {
            input.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + uVar12);
            input.value._0_8_ = *(undefined8 *)(pdVar4 + (uVar12 - 8));
            sVar15 = UnaryLambdaWrapper::
                     Operation<duckdb::BitwiseNOTOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                               (input,&local_a8,(idx_t)other,in_R8);
            *(long *)(pdVar11 + (uVar12 - 8)) = sVar15.value._0_8_;
            *(long *)(pdVar11 + uVar12) = sVar15.value._8_8_;
            uVar12 = uVar12 + 0x10;
          }
        }
        else {
          uVar12 = puVar3[(long)local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                                internal.
                                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr];
          p_Var6 = p_Var9 + 4;
          if (count._M_pi <= p_Var9 + 4) {
            p_Var6 = count._M_pi;
          }
          if (uVar12 == 0xffffffffffffffff) goto LAB_01d4e53a;
          p_Var5 = p_Var6;
          pVVar7 = other;
          if (uVar12 != 0) {
            uVar13 = (long)p_Var9 << 4 | 8;
            for (uVar10 = 0;
                p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&p_Var9->_vptr__Sp_counted_base + uVar10),
                pVVar7 = (ValidityMask *)
                         local_a8.super_TemplatedValidityMask<unsigned_long>.capacity,
                count._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                              internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi, p_Var5 < p_Var6; uVar10 = uVar10 + 1) {
              if ((uVar12 >> (uVar10 & 0x3f) & 1) != 0) {
                input_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + uVar13);
                input_00.value._0_8_ = *(undefined8 *)(pdVar4 + (uVar13 - 8));
                sVar15 = UnaryLambdaWrapper::
                         Operation<duckdb::BitwiseNOTOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                                   (input_00,&local_a8,(idx_t)other,in_R8);
                *(long *)(local_80 + (uVar13 - 8)) = sVar15.value._0_8_;
                *(long *)(local_80 + uVar13) = sVar15.value._8_8_;
                pdVar11 = local_80;
              }
              uVar13 = uVar13 + 0x10;
            }
          }
        }
        other = pVVar7;
        p_Var9 = p_Var5;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
    paVar2 = (anon_union_16_2_67f50693_for_value *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar16 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::BitwiseNOTOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                       ((string_t)paVar2->pointer,&local_a8,in_RCX,in_R8);
    paVar1->pointer = aVar16;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(idx_t)count._M_pi,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar11 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pdVar11 = pdVar11 + 8;
      for (p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != p_Var9;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var9->_vptr__Sp_counted_base + 1)) {
        idx = (local_78.sel)->sel_vector;
        p_Var6 = p_Var9;
        if (idx != (sel_t *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)idx[(long)p_Var9];
        }
        input_02.value.pointer.ptr =
             (char *)*(undefined8 *)(local_78.data + (long)p_Var6 * 0x10 + 8);
        input_02.value._0_8_ = *(undefined8 *)(local_78.data + (long)p_Var6 * 0x10);
        sVar15 = UnaryLambdaWrapper::
                 Operation<duckdb::BitwiseNOTOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                           (input_02,&local_a8,(idx_t)idx,in_R8);
        *(long *)(pdVar11 + -8) = sVar15.value._0_8_;
        *(long *)pdVar11 = sVar15.value._8_8_;
        pdVar11 = pdVar11 + 0x10;
      }
    }
    else {
      pdVar11 = pdVar11 + 8;
      for (p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != p_Var9;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var9->_vptr__Sp_counted_base + 1)) {
        p_Var6 = p_Var9;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (ulong)(local_78.sel)->sel_vector[(long)p_Var9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)p_Var6 >> 6] >> ((ulong)p_Var6 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,(idx_t)p_Var9);
        }
        else {
          input_01.value.pointer.ptr =
               (char *)*(undefined8 *)(local_78.data + (long)p_Var6 * 0x10 + 8);
          input_01.value._0_8_ = *(undefined8 *)(local_78.data + (long)p_Var6 * 0x10);
          sVar15 = UnaryLambdaWrapper::
                   Operation<duckdb::BitwiseNOTOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (input_01,&local_a8,
                              local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask[(ulong)p_Var6 >> 6],in_R8);
          *(long *)(pdVar11 + -8) = sVar15.value._0_8_;
          *(long *)pdVar11 = sVar15.value._8_8_;
        }
        pdVar11 = pdVar11 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void BitwiseNOTOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<string_t, string_t>(args.data[0], result, args.size(), [&](string_t input) {
		string_t target = StringVector::EmptyString(result, input.GetSize());

		Bit::BitwiseNot(input, target);
		return target;
	});
}